

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O3

void write_strings_cb(Fl_Widget *param_1,void *param_2)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  char sname [2048];
  char acStack_808 [2048];
  
  if ((filename == (char *)0x0) && (save_cb((Fl_Widget *)0x0,(void *)0x0), filename == (char *)0x0))
  {
    return;
  }
  pcVar2 = fl_filename_name(filename);
  fl_strlcpy(acStack_808,pcVar2,0x800);
  fl_filename_setext(acStack_808,0x800,
                     _ZZ16write_strings_cbP9Fl_WidgetPvE4exts_rel +
                     *(int *)(_ZZ16write_strings_cbP9Fl_WidgetPvE4exts_rel + (long)i18n_type * 4));
  if (batch_mode == 0) {
    goto_source_dir();
  }
  iVar1 = write_strings(acStack_808);
  if ((batch_mode == 0) && (leave_source_dir(), batch_mode == 0)) {
    if (iVar1 != 0) {
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      fl_message("Can\'t write %s: %s",acStack_808,pcVar2);
      return;
    }
    if ((completion_button->super_Fl_Light_Button).super_Fl_Button.value_ == '\0') {
      return;
    }
    fl_message("Wrote %s",acStack_808);
    return;
  }
  if (iVar1 == 0) {
    return;
  }
  write_strings_cb();
  if (Fl_Type::current == (Fl_Type *)0x0) {
    fl_message("Please select a widget");
    return;
  }
  (*Fl_Type::current->_vptr_Fl_Type[0xb])();
  return;
}

Assistant:

void write_strings_cb(Fl_Widget *, void *) {
  static const char *exts[] = { ".txt", ".po", ".msg" };
  if (!filename) {
    save_cb(0,0);
    if (!filename) return;
  }
  char sname[FL_PATH_MAX];
  strlcpy(sname, fl_filename_name(filename), sizeof(sname));
  fl_filename_setext(sname, sizeof(sname), exts[i18n_type]);
  if (!batch_mode) goto_source_dir();
  int x = write_strings(sname);
  if (!batch_mode) leave_source_dir();
  if (batch_mode) {
    if (x) {fprintf(stderr,"%s : %s\n",sname,strerror(errno)); exit(1);}
  } else {
    if (x) {
      fl_message("Can't write %s: %s", sname, strerror(errno));
    } else if (completion_button->value()) {
      fl_message("Wrote %s", sname);
    }
  }
}